

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

StringEntry * __thiscall
cmELFInternalImpl<cmELFTypes64>::GetDynamicSectionString
          (cmELFInternalImpl<cmELFTypes64> *this,uint tag)

{
  _Rb_tree_header *p_Var1;
  pointer paVar2;
  pointer paVar3;
  basic_istream<char,_std::char_traits<char>_> *pbVar4;
  cmELF *pcVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  pointer paVar8;
  long *plVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  byte bVar16;
  _Base_ptr p_Var17;
  bool bVar18;
  char c;
  char local_45;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  p_Var6 = (this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header;
    p_Var17 = &p_Var1->_M_header;
    do {
      bVar18 = p_Var6[1]._M_color < tag;
      if (!bVar18) {
        p_Var17 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar18];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var17 != p_Var1) && (p_Var17[1]._M_color <= tag)) {
      if (p_Var17[2]._M_parent == (_Base_ptr)0x0) {
        return (mapped_type *)0x0;
      }
      return (StringEntry *)&p_Var17[1]._M_parent;
    }
  }
  local_44 = tag;
  pmVar7 = std::
           map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
           ::operator[](&(this->super_cmELFInternal).DynamicSectionStrings,&local_44);
  pmVar7->Position = 0;
  pmVar7->Size = 0;
  pmVar7->IndexInSection = -1;
  bVar18 = LoadDynamicSection(this);
  if (!bVar18) {
    return (mapped_type *)0x0;
  }
  paVar2 = (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar11 = (ulong)paVar2[(this->super_cmELFInternal).DynamicSectionIndex].sh_link;
  if (uVar11 < (ulong)((long)(this->SectionHeaders).
                             super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)paVar2 >> 6)) {
    paVar8 = (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar3 = (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (paVar8 == paVar3) {
      return (mapped_type *)0x0;
    }
    lVar15 = -(long)paVar8;
    while (paVar8->d_tag != (ulong)local_44) {
      paVar8 = paVar8 + 1;
      lVar15 = lVar15 + -0x10;
      if (paVar8 == paVar3) {
        return (mapped_type *)0x0;
      }
    }
    uVar13 = (paVar8->d_un).d_val;
    local_40 = paVar2[uVar11].sh_size;
    if (uVar13 < local_40) {
      bVar16 = 0;
      std::istream::seekg((this->super_cmELFInternal).Stream._M_t.
                          super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                          ._M_head_impl,paVar2[uVar11].sh_offset + uVar13,0);
      local_38 = uVar13;
      do {
        plVar9 = (long *)std::istream::get((char *)(this->super_cmELFInternal).Stream._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                                  ._M_head_impl);
        uVar14 = uVar13;
        if (((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) ||
           ((bool)(bVar16 & local_45 != '\0'))) break;
        if (local_45 == '\0') {
          bVar16 = 1;
        }
        else {
          std::__cxx11::string::push_back((char)pmVar7);
        }
        uVar13 = uVar13 + 1;
        uVar14 = local_40;
      } while (local_40 != uVar13);
      pbVar4 = (this->super_cmELFInternal).Stream._M_t.
               super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl;
      if (((byte)pbVar4[*(long *)(*(long *)pbVar4 + -0x18) + 0x20] & 5) == 0) {
        pmVar7->Position = local_38 + paVar2[uVar11].sh_offset;
        pmVar7->Size = uVar14 - local_38;
        pmVar7->IndexInSection =
             (int)((ulong)-((long)&((this->DynamicSectionEntries).
                                    super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->d_tag + lVar15) >> 4)
        ;
        return pmVar7;
      }
      pcVar5 = (this->super_cmELFInternal).External;
      std::__cxx11::string::_M_replace
                ((ulong)&pcVar5->ErrorMessage,0,(char *)(pcVar5->ErrorMessage)._M_string_length,
                 0x24493a);
      (this->super_cmELFInternal).ELFType = FileTypeInvalid;
      std::__cxx11::string::_M_replace
                ((ulong)pmVar7,0,(char *)(pmVar7->Value)._M_string_length,0x24b9f7);
      return (mapped_type *)0x0;
    }
    pcVar5 = (this->super_cmELFInternal).External;
    pcVar12 = (char *)(pcVar5->ErrorMessage)._M_string_length;
    pcVar10 = "Section DYNAMIC references string beyond the end of its string section.";
  }
  else {
    pcVar5 = (this->super_cmELFInternal).External;
    pcVar12 = (char *)(pcVar5->ErrorMessage)._M_string_length;
    pcVar10 = "Section DYNAMIC has invalid string table index.";
  }
  std::__cxx11::string::_M_replace((ulong)&pcVar5->ErrorMessage,0,pcVar12,(ulong)pcVar10);
  (this->super_cmELFInternal).ELFType = FileTypeInvalid;
  return (mapped_type *)0x0;
}

Assistant:

cmELF::StringEntry const* cmELFInternalImpl<Types>::GetDynamicSectionString(
  unsigned int tag)
{
  // Short-circuit if already checked.
  auto dssi = this->DynamicSectionStrings.find(tag);
  if (dssi != this->DynamicSectionStrings.end()) {
    if (dssi->second.Position > 0) {
      return &dssi->second;
    }
    return nullptr;
  }

  // Create an entry for this tag.  Assume it is missing until found.
  StringEntry& se = this->DynamicSectionStrings[tag];
  se.Position = 0;
  se.Size = 0;
  se.IndexInSection = -1;

  // Try reading the dynamic section.
  if (!this->LoadDynamicSection()) {
    return nullptr;
  }

  // Get the string table referenced by the DYNAMIC section.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if (sec.sh_link >= this->SectionHeaders.size()) {
    this->SetErrorMessage("Section DYNAMIC has invalid string table index.");
    return nullptr;
  }
  ELF_Shdr const& strtab = this->SectionHeaders[sec.sh_link];

  // Look for the requested entry.
  for (auto di = this->DynamicSectionEntries.begin();
       di != this->DynamicSectionEntries.end(); ++di) {
    ELF_Dyn& dyn = *di;
    if (static_cast<tagtype>(dyn.d_tag) == static_cast<tagtype>(tag)) {
      // We found the tag requested.
      // Make sure the position given is within the string section.
      if (dyn.d_un.d_val >= strtab.sh_size) {
        this->SetErrorMessage("Section DYNAMIC references string beyond "
                              "the end of its string section.");
        return nullptr;
      }

      // Seek to the position reported by the entry.
      unsigned long first = static_cast<unsigned long>(dyn.d_un.d_val);
      unsigned long last = first;
      unsigned long end = static_cast<unsigned long>(strtab.sh_size);
      this->Stream->seekg(strtab.sh_offset + first);

      // Read the string.  It may be followed by more than one NULL
      // terminator.  Count the total size of the region allocated to
      // the string.  This assumes that the next string in the table
      // is non-empty, but the "chrpath" tool makes the same
      // assumption.
      bool terminated = false;
      char c;
      while (last != end && this->Stream->get(c) && !(terminated && c)) {
        ++last;
        if (c) {
          se.Value += c;
        } else {
          terminated = true;
        }
      }

      // Make sure the whole value was read.
      if (!(*this->Stream)) {
        this->SetErrorMessage("Dynamic section specifies unreadable RPATH.");
        se.Value = "";
        return nullptr;
      }

      // The value has been read successfully.  Report it.
      se.Position = static_cast<unsigned long>(strtab.sh_offset + first);
      se.Size = last - first;
      se.IndexInSection =
        static_cast<int>(di - this->DynamicSectionEntries.begin());
      return &se;
    }
  }
  return nullptr;
}